

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ReadFileResult
anon_unknown.dwarf_1197c6c::TryReachPresetFromWorkflow<cmCMakePresetsGraph::BuildPreset>
          (WorkflowPreset *origin,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
          *presets,string *name,ConfigurePreset **configurePreset)

{
  size_t __n;
  int iVar1;
  const_iterator cVar2;
  size_type sVar3;
  ReadFileResult RVar4;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
          ::find(&presets->_M_t,name);
  RVar4 = INVALID_WORKFLOW_STEPS;
  if ((_Rb_tree_header *)cVar2._M_node != &(presets->_M_t)._M_impl.super__Rb_tree_header) {
    sVar3 = std::
            _Hashtable<cmCMakePresetsGraph::File_*,_cmCMakePresetsGraph::File_*,_std::allocator<cmCMakePresetsGraph::File_*>,_std::__detail::_Identity,_std::equal_to<cmCMakePresetsGraph::File_*>,_std::hash<cmCMakePresetsGraph::File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(((origin->super_Preset).OriginFile)->ReachableFiles)._M_h,
                    (key_type *)&cVar2._M_node[4]._M_parent);
    if (sVar3 == 0) {
      RVar4 = WORKFLOW_STEP_UNREACHABLE_FROM_FILE;
    }
    else {
      __n = *(size_t *)(cVar2._M_node + 9);
      if (__n == ((*configurePreset)->super_Preset).Name._M_string_length) {
        if (__n == 0) {
          RVar4 = READ_OK;
        }
        else {
          iVar1 = bcmp(cVar2._M_node[8]._M_right,
                       ((*configurePreset)->super_Preset).Name._M_dataplus._M_p,__n);
          RVar4 = INVALID_WORKFLOW_STEPS;
          if (iVar1 == 0) {
            RVar4 = READ_OK;
          }
        }
      }
    }
  }
  return RVar4;
}

Assistant:

ReadFileResult TryReachPresetFromWorkflow(
  const WorkflowPreset& origin,
  const std::map<std::string, PresetPair<T>>& presets, const std::string& name,
  const ConfigurePreset*& configurePreset)
{
  auto it = presets.find(name);
  if (it == presets.end()) {
    return ReadFileResult::INVALID_WORKFLOW_STEPS;
  }
  if (!origin.OriginFile->ReachableFiles.count(
        it->second.Unexpanded.OriginFile)) {
    return ReadFileResult::WORKFLOW_STEP_UNREACHABLE_FROM_FILE;
  }
  return SetupWorkflowConfigurePreset<T>(it->second.Unexpanded,
                                         configurePreset);
}